

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogGetPublic(xmlChar *pubID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  xmlChar *ret;
  xmlChar *pubID_local;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalog();
  }
  if (xmlCatalogGetPublic::msg == 0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Use of deprecated xmlCatalogGetPublic() call\n");
    xmlCatalogGetPublic::msg = xmlCatalogGetPublic::msg + 1;
  }
  if (pubID == (xmlChar *)0x0) {
    pubID_local = (xmlChar *)0x0;
  }
  else if (((xmlDefaultCatalog == (xmlCatalogPtr)0x0) ||
           (pxVar4 = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml,pubID,(xmlChar *)0x0),
           pxVar4 == (xmlChar *)0x0)) || (pxVar4 == (xmlChar *)0xffffffffffffffff)) {
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      pubID_local = (xmlChar *)0x0;
    }
    else {
      pubID_local = xmlCatalogGetSGMLPublic(xmlDefaultCatalog->sgml,pubID);
    }
  }
  else {
    snprintf((char *)xmlCatalogGetPublic::result,999,"%s",pxVar4);
    xmlCatalogGetPublic::result[999] = '\0';
    pubID_local = xmlCatalogGetPublic::result;
  }
  return pubID_local;
}

Assistant:

const xmlChar *
xmlCatalogGetPublic(const xmlChar *pubID) {
    xmlChar *ret;
    static xmlChar result[1000];
    static int msg = 0;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (msg == 0) {
	xmlGenericError(xmlGenericErrorContext,
		"Use of deprecated xmlCatalogGetPublic() call\n");
	msg++;
    }

    if (pubID == NULL)
	return(NULL);

    /*
     * Check first the XML catalogs
     */
    if (xmlDefaultCatalog != NULL) {
	ret = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml, pubID, NULL);
	if ((ret != NULL) && (ret != XML_CATAL_BREAK)) {
	    snprintf((char *) result, sizeof(result) - 1, "%s", (char *) ret);
	    result[sizeof(result) - 1] = 0;
	    return(result);
	}
    }

    if (xmlDefaultCatalog != NULL)
	return(xmlCatalogGetSGMLPublic(xmlDefaultCatalog->sgml, pubID));
    return(NULL);
}